

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O2

int __thiscall
jrtplib::
RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
::AddElement(RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
             *this,uint *k,PortInfo **elem)

{
  HashElement *pHVar1;
  ulong uVar2;
  int iVar3;
  HashElement **ppHVar4;
  HashElement *pHVar5;
  HashElement **ppHVar6;
  bool bVar7;
  
  bVar7 = false;
  uVar2 = (ulong)*k % 0x207d;
  ppHVar6 = this->table + uVar2;
  ppHVar4 = ppHVar6;
  do {
    pHVar1 = *ppHVar4;
    do {
      if ((bVar7) || (pHVar1 == (HashElement *)0x0)) {
        if (bVar7) {
          iVar3 = -9;
        }
        else {
          pHVar5 = (HashElement *)
                   operator_new(0x30,(this->super_RTPMemoryObject).mgr,this->memorytype);
          pHVar5->key = *k;
          pHVar5->element = *elem;
          pHVar5->listprev = (HashElement *)0x0;
          pHVar5->listnext = (HashElement *)0x0;
          pHVar5->hashprev = (HashElement *)0x0;
          pHVar5->hashnext = (HashElement *)0x0;
          pHVar5->hashindex = (int)uVar2;
          pHVar1 = *ppHVar6;
          *ppHVar6 = pHVar5;
          pHVar5->hashnext = pHVar1;
          if (pHVar1 != (HashElement *)0x0) {
            pHVar1->hashprev = pHVar5;
          }
          if (this->firsthashelem == (HashElement *)0x0) {
            this->firsthashelem = pHVar5;
          }
          else {
            pHVar1 = this->lasthashelem;
            pHVar1->listnext = pHVar5;
            pHVar5->listprev = pHVar1;
          }
          this->lasthashelem = pHVar5;
          iVar3 = 0;
        }
        return iVar3;
      }
      bVar7 = pHVar1->key == *k;
    } while (bVar7);
    ppHVar4 = &pHVar1->hashnext;
  } while( true );
}

Assistant:

inline int RTPKeyHashTable<Key,Element,GetIndex,hashsize>::AddElement(const Key &k,const Element &elem)
{
	int index;
	bool found;
	HashElement *e,*newelem;
	
	index = GetIndex::GetIndex(k);
	if (index >= hashsize)
		return ERR_RTP_KEYHASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	e = table[index];
	found = false;
	while(!found && e != 0)
	{
		if (e->GetKey() == k)
			found = true;
		else
			e = e->hashnext;
	}
	if (found)
		return ERR_RTP_KEYHASHTABLE_KEYALREADYEXISTS;
	
	// Okay, the key doesn't exist, so we can add the new element in the hash table
	
	newelem = RTPNew(GetMemoryManager(),memorytype) HashElement(k,elem,index);
	if (newelem == 0)
		return ERR_RTP_OUTOFMEM;

	e = table[index];
	table[index] = newelem;
	newelem->hashnext = e;
	if (e != 0)
		e->hashprev = newelem;
	
	// Now, we still got to add it to the linked list
	
	if (firsthashelem == 0)
	{
		firsthashelem = newelem;
		lasthashelem = newelem;
	}
	else // there already are some elements in the list
	{
		lasthashelem->listnext = newelem;
		newelem->listprev = lasthashelem;
		lasthashelem = newelem;
	}
	return 0;
}